

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ToPrimitiveFree(JSContext *ctx,JSValue val,int hint)

{
  JSAtom JVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  JSAtom atom;
  JSValue JVar6;
  JSValue local_40;
  
  if ((int)val.tag != -1) {
    uVar3 = (ulong)val.u.ptr & 0xffffffff00000000;
    goto LAB_00130afb;
  }
  uVar4 = hint & 0xffffffef;
  if ((hint & 0x10U) == 0) {
    JVar6 = JS_GetPropertyInternal(ctx,val,0xc5,val,0);
    if ((int)JVar6.tag - 2U < 2) goto LAB_00130943;
    if ((int)JVar6.tag == 6) goto LAB_00130ae5;
    JVar1 = 0x16;
    if (uVar4 == 1) {
      JVar1 = 0x46;
    }
    atom = 0x48;
    if (uVar4 != 0) {
      atom = JVar1;
    }
    local_40 = JS_AtomToString(ctx,atom);
    JVar6 = JS_CallFree(ctx,JVar6,val,1,&local_40);
    JS_FreeValue(ctx,local_40);
    if ((JVar6.tag & 0xffffffffU) == 6) goto LAB_00130ae5;
    JS_FreeValue(ctx,val);
    if ((int)JVar6.tag != -1) {
LAB_00130a0a:
      uVar3 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
      val = JVar6;
      goto LAB_00130afb;
    }
    JS_FreeValue(ctx,JVar6);
    JS_ThrowTypeError(ctx,"toPrimitive");
  }
  else {
LAB_00130943:
    for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
      JVar6 = JS_GetPropertyInternal(ctx,val,(uint)((uVar4 != 0) != uVar5) * 2 + 0x37,val,0);
      if ((int)JVar6.tag == 6) goto LAB_00130ae5;
      iVar2 = JS_IsFunction(ctx,JVar6);
      if (iVar2 != 0) {
        JVar6 = JS_CallFree(ctx,JVar6,val,0,(JSValue *)0x0);
        if ((int)JVar6.tag != -1) {
          if ((int)JVar6.tag == 6) goto LAB_00130ae5;
          JS_FreeValue(ctx,val);
          goto LAB_00130a0a;
        }
      }
      JS_FreeValue(ctx,JVar6);
    }
    JS_ThrowTypeError(ctx,"toPrimitive");
LAB_00130ae5:
    JS_FreeValue(ctx,val);
  }
  val = (JSValue)(ZEXT816(6) << 0x40);
  uVar3 = 0;
LAB_00130afb:
  JVar6.u.ptr = (void *)((ulong)val.u.ptr & 0xffffffff | uVar3);
  JVar6.tag = val.tag;
  return JVar6;
}

Assistant:

static JSValue JS_ToPrimitiveFree(JSContext *ctx, JSValue val, int hint)
{
    int i;
    BOOL force_ordinary;

    JSAtom method_name;
    JSValue method, ret;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return val;
    force_ordinary = hint & HINT_FORCE_ORDINARY;
    hint &= ~HINT_FORCE_ORDINARY;
    if (!force_ordinary) {
        method = JS_GetProperty(ctx, val, JS_ATOM_Symbol_toPrimitive);
        if (JS_IsException(method))
            goto exception;
        /* ECMA says *If exoticToPrim is not undefined* but tests in
           test262 use null as a non callable converter */
        if (!JS_IsUndefined(method) && !JS_IsNull(method)) {
            JSAtom atom;
            JSValue arg;
            switch(hint) {
            case HINT_STRING:
                atom = JS_ATOM_string;
                break;
            case HINT_NUMBER:
                atom = JS_ATOM_number;
                break;
            default:
            case HINT_NONE:
                atom = JS_ATOM_default;
                break;
            }
            arg = JS_AtomToString(ctx, atom);
            ret = JS_CallFree(ctx, method, val, 1, (JSValueConst *)&arg);
            JS_FreeValue(ctx, arg);
            if (JS_IsException(ret))
                goto exception;
            JS_FreeValue(ctx, val);
            if (JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT)
                return ret;
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "toPrimitive");
        }
    }
    if (hint != HINT_STRING)
        hint = HINT_NUMBER;
    for(i = 0; i < 2; i++) {
        if ((i ^ hint) == 0) {
            method_name = JS_ATOM_toString;
        } else {
            method_name = JS_ATOM_valueOf;
        }
        method = JS_GetProperty(ctx, val, method_name);
        if (JS_IsException(method))
            goto exception;
        if (JS_IsFunction(ctx, method)) {
            ret = JS_CallFree(ctx, method, val, 0, NULL);
            if (JS_IsException(ret))
                goto exception;
            if (JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT) {
                JS_FreeValue(ctx, val);
                return ret;
            }
            JS_FreeValue(ctx, ret);
        } else {
            JS_FreeValue(ctx, method);
        }
    }
    JS_ThrowTypeError(ctx, "toPrimitive");
exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}